

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

SnapArrayInfoBlock<void_*> *
TTD::NSSnapObjects::AllocateArrayInfoBlock<void*,true>
          (SlabAllocator *alloc,uint32 firstIndex,uint32 lastIndex)

{
  SnapArrayInfoBlock<void_*> *pSVar1;
  void **ppvVar2;
  uchar *puVar3;
  SnapArrayInfoBlock<void_*> *sai;
  uint32 lastIndex_local;
  uint32 firstIndex_local;
  SlabAllocator *alloc_local;
  
  pSVar1 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayInfoBlock<void*>>
                     (alloc);
  pSVar1->FirstIndex = firstIndex;
  pSVar1->LastIndex = lastIndex;
  ppvVar2 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)(lastIndex - firstIndex));
  pSVar1->ArrayRangeContents = ppvVar2;
  puVar3 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>
                     (alloc,(ulong)(lastIndex - firstIndex));
  pSVar1->ArrayValidTags = puVar3;
  memset(pSVar1->ArrayValidTags,0,(ulong)(lastIndex - firstIndex));
  pSVar1->Next = (SnapArrayInfoBlock<void_*> *)0x0;
  return pSVar1;
}

Assistant:

SnapArrayInfoBlock<T>* AllocateArrayInfoBlock(SlabAllocator& alloc, uint32 firstIndex, uint32 lastIndex)
        {
            SnapArrayInfoBlock<T>* sai = alloc.SlabAllocateStruct< SnapArrayInfoBlock<T> >();
            sai->FirstIndex = firstIndex;
            sai->LastIndex = lastIndex;

            sai->ArrayRangeContents = alloc.SlabAllocateArray<T>(lastIndex - firstIndex);
            sai->ArrayValidTags = alloc.SlabAllocateArray<byte>(lastIndex - firstIndex);

            //only zero valid flags (which guard the contents values)
            if(zeroFillValid)
            {
                memset(sai->ArrayValidTags, 0, lastIndex - firstIndex);
            }

            sai->Next = nullptr;

            return sai;
        }